

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O0

void __thiscall
HVectorBase<HighsCDouble>::copy<double>(HVectorBase<HighsCDouble> *this,HVectorBase<double> *from)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  long in_RSI;
  long in_RDI;
  HVectorBase<HighsCDouble> *unaff_retaddr;
  double xFrom;
  HighsInt iFrom;
  HighsInt i;
  double *fromArray;
  HighsInt *fromIndex;
  HighsInt fromCount;
  HighsCDouble local_48;
  double local_38;
  int local_30;
  int local_2c;
  const_reference local_28;
  const_reference local_20;
  int local_14;
  long local_10;
  
  local_10 = in_RSI;
  clear(unaff_retaddr);
  *(undefined8 *)(in_RDI + 0x38) = *(undefined8 *)(local_10 + 0x38);
  local_14 = *(int *)(local_10 + 4);
  *(int *)(in_RDI + 4) = local_14;
  local_20 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_10 + 8),0);
  local_28 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_10 + 0x20),0);
  for (local_2c = 0; local_2c < local_14; local_2c = local_2c + 1) {
    iVar1 = local_20[local_2c];
    local_38 = local_28[iVar1];
    local_30 = iVar1;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_2c);
    *pvVar2 = iVar1;
    HighsCDouble::HighsCDouble(&local_48,local_38);
    pvVar3 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                       ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(in_RDI + 0x20),
                        (long)local_30);
    pvVar3->hi = local_48.hi;
    pvVar3->lo = local_48.lo;
  }
  return;
}

Assistant:

void HVectorBase<Real>::copy(const HVectorBase<FromReal>* from) {
  /*
   * Copy from another HVector structure to this instance
   * The real type of "from" does not need to be the same, but must be
   * convertible to this HVector's real type.
   */
  clear();
  synthetic_tick = from->synthetic_tick;
  const HighsInt fromCount = count = from->count;
  const HighsInt* fromIndex = &from->index[0];
  const FromReal* fromArray = &from->array[0];
  for (HighsInt i = 0; i < fromCount; i++) {
    const HighsInt iFrom = fromIndex[i];
    const FromReal xFrom = fromArray[iFrom];
    index[i] = iFrom;
    array[iFrom] = Real(xFrom);
  }
}